

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx2.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct_x86_avx2::create_pipeline(InnerProduct_x86_avx2 *this,Option *opt)

{
  int iVar1;
  int iVar2;
  Layer *pLVar3;
  float *pfVar4;
  long in_RSI;
  Mat *in_RDI;
  int j;
  int p;
  float *g0;
  int q;
  Mat weight_data_r2;
  int out_elempack;
  int num_input;
  ParamDict pd;
  ParamDict *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  int index;
  size_t _elemsize;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  Mat *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  Mat *in_stack_ffffffffffffff78;
  Option *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar5;
  undefined1 local_28 [16];
  long local_18;
  int local_4;
  
  index = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_18 = in_RSI;
  pLVar3 = create_layer(index);
  in_RDI->refcount = (int *)pLVar3;
  ParamDict::ParamDict((ParamDict *)in_RDI);
  (**(code **)(*(long *)((ParamDictPrivate *)in_RDI->refcount)->params + 0x10))
            ((ParamDictPrivate *)in_RDI->refcount,local_28);
  (**(code **)(*(long *)((ParamDictPrivate *)in_RDI->refcount)->params + 0x20))
            ((ParamDictPrivate *)in_RDI->refcount,local_18);
  ParamDict::~ParamDict(in_stack_ffffffffffffff30);
  if (((*(byte *)(local_18 + 0x1e) & 1) == 0) ||
     (*(long *)((long)&in_RDI[4].allocator + (long)*(_func_int **)((long)in_RDI->data + -0x18)) != 1
     )) {
    iVar1 = *(int *)((long)&in_RDI[3].data + (long)*(_func_int **)((long)in_RDI->data + -0x18));
    iVar2 = *(int *)((long)&in_RDI[2].cstep + (long)*(_func_int **)((long)in_RDI->data + -0x18));
    iVar5 = 1;
    if ((*(byte *)(local_18 + 0x27) & 1) != 0) {
      if (*(int *)((long)&in_RDI[2].cstep + (long)*(_func_int **)((long)in_RDI->data + -0x18)) % 8
          == 0) {
        in_stack_ffffffffffffff4c = 8;
        iVar5 = in_stack_ffffffffffffff4c;
      }
      else {
        in_stack_ffffffffffffff4c = 1;
        iVar5 = in_stack_ffffffffffffff4c;
        if (*(int *)((long)&in_RDI[2].cstep + (long)*(_func_int **)((long)in_RDI->data + -0x18)) % 4
            == 0) {
          in_stack_ffffffffffffff4c = 4;
          iVar5 = in_stack_ffffffffffffff4c;
        }
      }
    }
    if (iVar5 != 1) {
      _elemsize = 0;
      ncnn::Mat::reshape(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                         in_stack_ffffffffffffff70,(Allocator *)in_stack_ffffffffffffff68);
      ncnn::Mat::create(in_RDI,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,_elemsize,index,
                        (Allocator *)in_stack_ffffffffffffff30);
      for (in_stack_ffffffffffffff74 = 0;
          in_stack_ffffffffffffff74 + iVar5 + -1 <
          *(int *)((long)&in_RDI[2].cstep + (long)*(_func_int **)((long)in_RDI->data + -0x18));
          in_stack_ffffffffffffff74 = iVar5 + in_stack_ffffffffffffff74) {
        in_stack_ffffffffffffff68 =
             (Mat *)ncnn::Mat::row((Mat *)&in_RDI->elempack,in_stack_ffffffffffffff74 / iVar5);
        for (in_stack_ffffffffffffff64 = 0; in_stack_ffffffffffffff64 < iVar1 / iVar2;
            in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 + 1) {
          for (in_stack_ffffffffffffff60 = 0; in_stack_ffffffffffffff60 < iVar5;
              in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 + 1) {
            pfVar4 = ncnn::Mat::row((Mat *)&stack0xffffffffffffff78,
                                    in_stack_ffffffffffffff74 + in_stack_ffffffffffffff60);
            *(float *)&in_stack_ffffffffffffff68->data = pfVar4[in_stack_ffffffffffffff64];
            in_stack_ffffffffffffff68 = (Mat *)((long)&in_stack_ffffffffffffff68->data + 4);
          }
        }
      }
      ncnn::Mat::~Mat((Mat *)0x3b5943);
    }
    if (((*(byte *)(local_18 + 0x2f) & 1) == 0) ||
       (*(long *)((long)&in_RDI[4].allocator + (long)*(_func_int **)((long)in_RDI->data + -0x18)) !=
        4)) {
      local_4 = 0;
    }
    else {
      cast_float32_to_float16
                ((Mat *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,
                 (Option *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      local_4 = 0;
    }
  }
  else {
    local_4 = create_pipeline_int8_x86
                        ((InnerProduct_x86_avx2 *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
  }
  return local_4;
}

Assistant:

int InnerProduct_x86_avx2::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (out_elempack != 1)
    {
        // src = inch-outch
        // dst = pb-inch-outch/pb
        {
            Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

            weight_data_packed.create(num_input, num_output / out_elempack, (size_t)4u * out_elempack, out_elempack);

            for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
            {
                float* g0 = weight_data_packed.row(q / out_elempack);

                for (int p = 0; p < num_input; p++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        *g0++ = weight_data_r2.row(q + j)[p];
                    }
                }
            }
        }
    }

#if __AVX2__
    if (opt.use_weight_fp16_storage && weight_data.elemsize == 4u)
    {
        ncnn::cast_float32_to_float16(weight_data, weight_data_fp16, opt);

        return 0;
    }
#endif

    return 0;
}